

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

Status __thiscall wallet::SQLiteCursor::Next(SQLiteCursor *this,DataStream *key,DataStream *value)

{
  pointer pbVar1;
  sqlite3_stmt *psVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  long lVar6;
  Status SVar7;
  char **in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  undefined8 local_e8 [14];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = sqlite3_step(this->m_cursor_stmt);
  if (iVar4 == 100) {
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    key->m_read_pos = 0;
    pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    value->m_read_pos = 0;
    psVar2 = this->m_cursor_stmt;
    lVar6 = sqlite3_column_blob(psVar2,0);
    iVar4 = sqlite3_column_bytes(psVar2,0);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)key,
               (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,lVar6,iVar4 + lVar6);
    psVar2 = this->m_cursor_stmt;
    SVar7 = MORE;
    lVar6 = sqlite3_column_blob(psVar2,1);
    iVar4 = sqlite3_column_bytes(psVar2,1);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)value,
               (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,lVar6,iVar4 + lVar6);
  }
  else {
    SVar7 = DONE;
    if (iVar4 != 0x65) {
      local_e8[0] = sqlite3_errstr(iVar4);
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar5);
      if (bVar3) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<char[5],char_const*>
                  (&local_78,(tinyformat *)"%s: Unable to execute cursor step: %s\n","Next",
                   (char (*) [5])local_e8,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar5 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5a;
        local_78._M_string_length = 0x85e8e8;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "Next";
        logging_function._M_len = 4;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x23a,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      SVar7 = FAIL;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar7;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status SQLiteCursor::Next(DataStream& key, DataStream& value)
{
    int res = sqlite3_step(m_cursor_stmt);
    if (res == SQLITE_DONE) {
        return Status::DONE;
    }
    if (res != SQLITE_ROW) {
        LogPrintf("%s: Unable to execute cursor step: %s\n", __func__, sqlite3_errstr(res));
        return Status::FAIL;
    }

    key.clear();
    value.clear();

    // Leftmost column in result is index 0
    key.write(SpanFromBlob(m_cursor_stmt, 0));
    value.write(SpanFromBlob(m_cursor_stmt, 1));
    return Status::MORE;
}